

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_free(archive *_a)

{
  int iVar1;
  wchar_t magic_test;
  archive_match *a;
  archive *_a_local;
  
  if (_a == (archive *)0x0) {
    _a_local._4_4_ = L'\0';
  }
  else {
    iVar1 = __archive_check_magic(_a,0xcad11c9,0xffff,"archive_match_free");
    if (iVar1 == -0x1e) {
      _a_local._4_4_ = L'\xffffffe2';
    }
    else {
      match_list_free((match_list *)&_a[1].file_count);
      match_list_free((match_list *)&_a[1].vtable);
      entry_list_free((entry_list *)&_a[2].file_count);
      free(_a[2].current_code);
      free(_a[2].read_data_block);
      match_list_free((match_list *)&_a[2].read_data_offset);
      match_list_free((match_list *)(_a + 3));
      free(_a);
      _a_local._4_4_ = L'\0';
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_match_free(struct archive *_a)
{
	struct archive_match *a;

	if (_a == NULL)
		return (ARCHIVE_OK);
	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_ANY | ARCHIVE_STATE_FATAL, "archive_match_free");
	a = (struct archive_match *)_a;
	match_list_free(&(a->inclusions));
	match_list_free(&(a->exclusions));
	entry_list_free(&(a->exclusion_entry_list));
	free(a->inclusion_uids.ids);
	free(a->inclusion_gids.ids);
	match_list_free(&(a->inclusion_unames));
	match_list_free(&(a->inclusion_gnames));
	free(a);
	return (ARCHIVE_OK);
}